

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

ON_LengthValue *
ON_LengthValue::CreateFromString
          (ON_LengthValue *__return_storage_ptr__,ON_ParseSettings parse_settings,wchar_t *string)

{
  ON_LengthValue *__return_storage_ptr___00;
  wchar_t *string_end;
  ON_LengthValue length_value;
  
  if ((string == (wchar_t *)0x0) || (*string == L'\0')) {
    ON_LengthValue(__return_storage_ptr__,&Unset);
  }
  else {
    string_end = (wchar_t *)0x0;
    __return_storage_ptr___00 = &length_value;
    CreateFromSubString(__return_storage_ptr___00,parse_settings,string,-1,&string_end);
    if (string_end <= string) {
      __return_storage_ptr___00 = &Unset;
    }
    ON_LengthValue(__return_storage_ptr__,__return_storage_ptr___00);
    ~ON_LengthValue(&length_value);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_LengthValue ON_LengthValue::CreateFromString(
  ON_ParseSettings parse_settings,
  const wchar_t* string
)
{
  if ( nullptr == string || 0 == string[0] )
    return ON_LengthValue::Unset;

  const wchar_t* string_end = nullptr;
  const ON_LengthValue length_value = ON_LengthValue::CreateFromSubString(parse_settings, string, -1, &string_end);
  if (nullptr == string_end || !(string < string_end))
  {
    // Calling ON_ERROR here causes .NET trauma when ON_LengthValue::CreateFromString() is used for 
    // input validation.
    //ON_ERROR("Invalid input parameters.");
    return ON_LengthValue::Unset;
  }

  return length_value;
}